

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::tightenCoefficients
          (HighsDomain *this,HighsInt *inds,double *vals,HighsInt len,double *rhs)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  HighsCDouble HVar10;
  HighsCDouble delta;
  HighsCDouble local_c8;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double *local_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  if (len == 0) {
    dVar8 = 0.0;
    local_a8 = 0.0;
  }
  else {
    uVar4 = 0;
    local_a8 = 0.0;
    dVar7 = 0.0;
    do {
      if (vals[uVar4] <= 0.0) {
        dVar9 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[inds[uVar4]];
        if (dVar9 <= -INFINITY) {
          return;
        }
      }
      else {
        dVar9 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[inds[uVar4]];
        if (INFINITY <= dVar9) {
          return;
        }
      }
      dVar9 = vals[uVar4] * dVar9;
      dVar8 = dVar7 + dVar9;
      local_a8 = local_a8 + (dVar7 - (dVar8 - dVar9)) + (dVar9 - (dVar8 - (dVar8 - dVar9)));
      uVar4 = uVar4 + 1;
      dVar7 = dVar8;
    } while ((uint)len != uVar4);
  }
  dVar7 = *rhs;
  uStack_90 = 0;
  local_b8 = dVar8 - dVar7;
  local_a8 = (-dVar7 - (local_b8 - dVar8)) + (dVar8 - (local_b8 - (local_b8 - dVar8))) + local_a8;
  uStack_b0 = 0;
  uStack_a0 = 0x8000000000000000;
  dVar8 = local_b8 + local_a8;
  pdVar1 = &((this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
  if (*pdVar1 <= dVar8 && dVar8 != *pdVar1) {
    local_80 = rhs;
    if (len == 0) {
      bVar6 = true;
      dVar9 = 0.0;
    }
    else {
      uStack_40 = 0;
      local_48 = -local_a8 - local_b8;
      local_78 = -local_b8;
      uStack_70 = 0x8000000000000000;
      local_58 = -dVar8;
      uStack_50 = 0x8000000000000000;
      dVar9 = 0.0;
      uVar4 = 0;
      iVar5 = 0;
      uStack_60 = 0;
      local_68 = dVar8;
      do {
        iVar3 = inds[uVar4];
        if ((this->mipsolver->model_->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3] != kContinuous) {
          dVar2 = vals[uVar4];
          local_98 = dVar7;
          if (dVar2 <= dVar8) {
            if (dVar2 < local_48) {
              local_c8.hi = -dVar2 - local_b8;
              local_c8.lo = ((-dVar2 - (local_b8 + local_c8.hi)) +
                            (local_78 - (local_c8.hi - (local_b8 + local_c8.hi)))) - local_a8;
              HVar10 = HighsCDouble::operator*
                                 (&local_c8,
                                  (this->col_lower_).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar3]);
              dVar8 = HVar10.hi;
              dVar7 = local_98 + dVar8;
              dVar9 = dVar9 + (local_98 - (dVar7 - dVar8)) + (dVar8 - (dVar7 - (dVar7 - dVar8))) +
                      HVar10.lo;
              vals[uVar4] = local_58;
              iVar5 = iVar5 + 1;
              dVar8 = local_68;
            }
          }
          else {
            local_c8.hi = dVar2 - local_b8;
            local_c8.lo = ((dVar2 - (local_b8 + local_c8.hi)) +
                          (local_78 - (local_c8.hi - (local_b8 + local_c8.hi)))) - local_a8;
            HVar10 = HighsCDouble::operator*
                               (&local_c8,
                                (this->col_upper_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar3]);
            dVar8 = HVar10.hi;
            dVar7 = local_98 - dVar8;
            dVar9 = (dVar9 + (local_98 - (dVar8 + dVar7)) + (-dVar8 - (dVar7 - (dVar8 + dVar7)))) -
                    HVar10.lo;
            vals[uVar4] = local_68;
            iVar5 = iVar5 + 1;
            dVar8 = local_68;
          }
        }
        uVar4 = uVar4 + 1;
      } while ((uint)len != uVar4);
      bVar6 = iVar5 == 0;
    }
    if (!bVar6) {
      *local_80 = dVar7 + dVar9;
    }
  }
  return;
}

Assistant:

void HighsDomain::tightenCoefficients(HighsInt* inds, double* vals,
                                      HighsInt len, double& rhs) const {
  HighsCDouble maxactivity = 0;

  for (HighsInt i = 0; i != len; ++i) {
    if (vals[i] > 0) {
      if (col_upper_[inds[i]] == kHighsInf) return;

      maxactivity += col_upper_[inds[i]] * vals[i];
    } else {
      if (col_lower_[inds[i]] == -kHighsInf) return;

      maxactivity += col_lower_[inds[i]] * vals[i];
    }
  }

  HighsCDouble maxabscoef = maxactivity - rhs;
  if (maxabscoef > mipsolver->mipdata_->feastol) {
    HighsCDouble upper = rhs;
    HighsInt tightened = 0;
    for (HighsInt i = 0; i != len; ++i) {
      if (mipsolver->variableType(inds[i]) == HighsVarType::kContinuous)
        continue;
      if (vals[i] > maxabscoef) {
        HighsCDouble delta = vals[i] - maxabscoef;
        upper -= delta * col_upper_[inds[i]];
        vals[i] = double(maxabscoef);
        ++tightened;
      } else if (vals[i] < -maxabscoef) {
        HighsCDouble delta = -vals[i] - maxabscoef;
        upper += delta * col_lower_[inds[i]];
        vals[i] = -double(maxabscoef);
        ++tightened;
      }
    }

    if (tightened != 0) {
      // printf("tightened %" HIGHSINT_FORMAT " coefficients, rhs changed from
      // %g to %g\n",
      //       tightened, rhs, double(upper));
      rhs = double(upper);
    }
  }
}